

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

LogicalType * duckdb::LogicalType::USER(LogicalType *__return_storage_ptr__,string *user_type_name)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_38;
  shared_ptr<duckdb::UserTypeInfo,_true> info;
  
  make_shared_ptr<duckdb::UserTypeInfo,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info);
  local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(info.internal.super___shared_ptr<duckdb::UserTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_ExtraTypeInfo;
  local_38.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       info.internal.super___shared_ptr<duckdb::UserTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  info.internal.super___shared_ptr<duckdb::UserTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  info.internal.super___shared_ptr<duckdb::UserTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LogicalType(__return_storage_ptr__,USER,&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &info.internal.super___shared_ptr<duckdb::UserTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::USER(const string &user_type_name) {
	auto info = make_shared_ptr<UserTypeInfo>(user_type_name);
	return LogicalType(LogicalTypeId::USER, std::move(info));
}